

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvreader.cc
# Opt level: O3

int __thiscall mkvparser::MkvReader::Open(MkvReader *this,char *fileName)

{
  bool bVar1;
  FILE *pFVar2;
  uint uVar3;
  
  uVar3 = 0xffffffff;
  if ((fileName != (char *)0x0) && (this->m_file == (FILE *)0x0)) {
    pFVar2 = fopen(fileName,"rb");
    this->m_file = (FILE *)pFVar2;
    if (pFVar2 != (FILE *)0x0) {
      bVar1 = GetFileSize(this);
      uVar3 = (uint)!bVar1;
    }
  }
  return uVar3;
}

Assistant:

int MkvReader::Open(const char* fileName) {
  if (fileName == NULL)
    return -1;

  if (m_file)
    return -1;

#ifdef _MSC_VER
  const errno_t e = fopen_s(&m_file, fileName, "rb");

  if (e)
    return -1;  // error
#else
  m_file = fopen(fileName, "rb");

  if (m_file == NULL)
    return -1;
#endif
  return !GetFileSize();
}